

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# counter.hpp
# Opt level: O3

void __thiscall
ylt::metric::basic_static_counter<double>::serialize(basic_static_counter<double> *this,string *str)

{
  pointer paVar1;
  atomic<std::atomic<double>_*> *t;
  pointer paVar2;
  double value;
  
  paVar2 = (this->default_label_value_).duplicates_.
           super__Vector_base<std::atomic<std::atomic<double>_*>,_std::allocator<std::atomic<std::atomic<double>_*>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  paVar1 = (this->default_label_value_).duplicates_.
           super__Vector_base<std::atomic<std::atomic<double>_*>,_std::allocator<std::atomic<std::atomic<double>_*>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  value = 0.0;
  if (paVar2 != paVar1) {
    do {
      if ((paVar2->_M_b)._M_p != (__pointer_type)0x0) {
        value = value + (((paVar2->_M_b)._M_p)->super___atomic_float<double>)._M_fp;
      }
      paVar2 = paVar2 + 1;
    } while (paVar2 != paVar1);
    if ((value != 0.0) || (NAN(value))) goto LAB_0019df0f;
  }
  if (this->has_change_ != true) {
    return;
  }
LAB_0019df0f:
  metric_t::serialize_head((metric_t *)this,str);
  serialize_default_label(this,str,value);
  return;
}

Assistant:

void serialize(std::string &str) override {
    auto value = default_label_value_.value();
    if (value == 0 && !has_change_) {
      return;
    }

    metric_t::serialize_head(str);
    serialize_default_label(str, value);
  }